

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::APFloat::convert(APFloat *this,fltSemantics *ToSemantics,roundingMode RM,bool *losesInfo)

{
  Storage *this_00;
  fltSemantics *pfVar1;
  opStatus oVar2;
  IEEEFloat *rhs;
  IEEEFloat local_80;
  Storage local_60;
  IEEEFloat local_48;
  
  pfVar1 = (this->U).semantics;
  if (pfVar1 == ToSemantics) {
    *losesInfo = false;
    oVar2 = opOK;
  }
  else {
    this_00 = &this->U;
    if (ToSemantics != (fltSemantics *)semPPCDoubleDouble &&
        pfVar1 != (fltSemantics *)semPPCDoubleDouble) {
      oVar2 = detail::IEEEFloat::convert(&this_00->IEEE,ToSemantics,RM,losesInfo);
      return oVar2;
    }
    if (ToSemantics == (fltSemantics *)semPPCDoubleDouble &&
        pfVar1 != (fltSemantics *)semPPCDoubleDouble) {
      oVar2 = detail::IEEEFloat::convert
                        (&this_00->IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,RM,losesInfo);
      detail::IEEEFloat::bitcastToAPInt(&local_80);
      detail::DoubleAPFloat::DoubleAPFloat
                ((DoubleAPFloat *)&local_60.IEEE,(fltSemantics *)semPPCDoubleDouble,
                 (APInt *)&local_80);
      Storage::operator=((Storage *)&this_00->IEEE,&local_60);
      Storage::~Storage((Storage *)&local_60.IEEE);
      if ((0x40 < (uint)local_80.significand.part._0_4_) &&
         (local_80.semantics != (fltSemantics *)0x0)) {
        operator_delete__(local_80.semantics);
      }
    }
    else {
      if ((ToSemantics == (fltSemantics *)semPPCDoubleDouble) ||
         (pfVar1 != (fltSemantics *)semPPCDoubleDouble)) {
        llvm_unreachable_internal
                  ("Unexpected semantics",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                   ,0x1175);
      }
      oVar2 = detail::IEEEFloat::convert
                        ((IEEEFloat *)((this->U).IEEE.significand.part + 8),ToSemantics,RM,losesInfo
                        );
      rhs = (IEEEFloat *)((this->U).IEEE.significand.part + 8);
      if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
        rhs = (IEEEFloat *)this_00;
      }
      detail::IEEEFloat::IEEEFloat(&local_48,rhs);
      detail::IEEEFloat::IEEEFloat(&local_80,&local_48);
      Storage::Storage((Storage *)&local_60.IEEE,&local_80,ToSemantics);
      detail::IEEEFloat::~IEEEFloat(&local_80);
      Storage::operator=((Storage *)&this_00->IEEE,&local_60);
      Storage::~Storage((Storage *)&local_60.IEEE);
      detail::IEEEFloat::~IEEEFloat(&local_48);
    }
  }
  return oVar2;
}

Assistant:

unsigned int IEEEFloat::significandMSB() const {
  return APInt::tcMSB(significandParts(), partCount());
}